

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O3

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::pickSubAny
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  uint32_t uVar1;
  HeapType HVar2;
  
  uVar1 = Random::upTo(this->rand,8);
  if (uVar1 == 1) {
    HVar2.id = (ulong)(share == Shared) * 4 + 0x58;
  }
  else {
    if (uVar1 != 0) {
      HVar2 = pickSubEq(this,share);
      return (HeapType)HVar2.id;
    }
    HVar2.id = (ulong)(share == Shared) * 4 + 0x20;
  }
  return (HeapType)HVar2.id;
}

Assistant:

HeapType pickSubAny(Shareability share) {
    switch (rand.upTo(8)) {
      case 0:
        return HeapTypes::any.getBasic(share);
      case 1:
        return HeapTypes::none.getBasic(share);
      default:
        return pickSubEq(share);
    }
    WASM_UNREACHABLE("unexpected index");
  }